

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SyntaxNode *args_2;
  AssignmentPatternItemSyntax *pAVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AssignmentPatternItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_30,
                      (ExpressionSyntax *)args_2);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AssignmentPatternItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AssignmentPatternItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.key, alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc)
    );
}